

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsmooth.c
# Opt level: O0

FT_Error ft_smooth_init(FT_Renderer_conflict render)

{
  FT_Library pFVar1;
  FT_Vector *sub;
  FT_Renderer_conflict render_local;
  
  pFVar1 = (render->root).library;
  pFVar1->lcd_geometry[0].x = -0x15;
  pFVar1->lcd_geometry[0].y = 0;
  pFVar1->lcd_geometry[1].x = 0;
  pFVar1->lcd_geometry[1].y = 0;
  pFVar1->lcd_geometry[2].x = 0x15;
  pFVar1->lcd_geometry[2].y = 0;
  (*render->clazz->raster_class->raster_reset)(render->raster,(uchar *)0x0,0);
  return 0;
}

Assistant:

static FT_Error
  ft_smooth_init( FT_Renderer  render )
  {
    FT_Vector*  sub = render->root.library->lcd_geometry;


    /* set up default subpixel geometry for striped RGB panels. */
    sub[0].x = -21;
    sub[0].y = 0;
    sub[1].x = 0;
    sub[1].y = 0;
    sub[2].x = 21;
    sub[2].y = 0;

    render->clazz->raster_class->raster_reset( render->raster, NULL, 0 );

    return 0;
  }